

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_00;
  uint32 uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  UnknownField *field;
  int local_18;
  int i;
  int left;
  int number_local;
  UnknownFieldSet *this_local;
  
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    local_18 = 0;
    for (field._4_4_ = 0;
        sVar3 = std::
                vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ::size(this->fields_), (ulong)(long)field._4_4_ < sVar3;
        field._4_4_ = field._4_4_ + 1) {
      pvVar4 = std::
               vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ::operator[](this->fields_,(long)field._4_4_);
      iVar2 = UnknownField::number(pvVar4);
      if (iVar2 == number) {
        UnknownField::Delete(pvVar4);
      }
      else {
        if (field._4_4_ != local_18) {
          pvVar4 = std::
                   vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ::operator[](this->fields_,(long)field._4_4_);
          pvVar5 = std::
                   vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ::operator[](this->fields_,(long)local_18);
          uVar1 = pvVar4->type_;
          pvVar5->number_ = pvVar4->number_;
          pvVar5->type_ = uVar1;
          pvVar5->data_ = pvVar4->data_;
        }
        local_18 = local_18 + 1;
      }
    }
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    resize(this->fields_,(long)local_18);
    if (local_18 == 0) {
      this_00 = this->fields_;
      if (this_00 !=
          (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *
          )0x0) {
        std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ::~vector(this_00);
        operator_delete(this_00,0x18);
      }
      this->fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  if (fields_ == NULL) return;
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_->size(); ++i) {
    UnknownField* field = &(*fields_)[i];
    if (field->number() == number) {
      field->Delete();
    } else {
      if (i != left) {
        (*fields_)[left] = (*fields_)[i];
      }
      ++left;
    }
  }
  fields_->resize(left);
  if (left == 0) {
    // maintain invariant: never hold fields_ if empty.
    delete fields_;
    fields_ = NULL;
  }
}